

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode Curl_http2_done_sending(Curl_easy *data,connectdata *conn)

{
  HTTP *pHVar1;
  nghttp2_session *session;
  connectdata *pcVar2;
  int iVar3;
  int rv;
  SingleRequest *k;
  nghttp2_session *h2;
  http_conn *httpc;
  HTTP *stream;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  stream._4_4_ = CURLE_OK;
  if ((conn->handler == &Curl_handler_http2_ssl) || (conn->handler == &Curl_handler_http2)) {
    pHVar1 = (data->req).p.http;
    session = (conn->proto).httpc.h2;
    pcStack_18 = conn;
    conn_local = (connectdata *)data;
    if (pHVar1->upload_left != 0) {
      pHVar1->upload_left = 0;
      nghttp2_session_resume_data(session,pHVar1->stream_id);
      h2_process_pending_input
                ((Curl_easy *)conn_local,&(conn->proto).httpc,(CURLcode *)((long)&stream + 4));
    }
    iVar3 = nghttp2_session_want_write(session);
    pcVar2 = conn_local;
    if (iVar3 != 0) {
      iVar3 = h2_session_send((Curl_easy *)conn_local,session);
      if (iVar3 != 0) {
        stream._4_4_ = CURLE_SEND_ERROR;
      }
      iVar3 = nghttp2_session_want_write(session);
      if (iVar3 != 0) {
        *(uint *)&(pcVar2->http_proxy).field_0x2c = *(uint *)&(pcVar2->http_proxy).field_0x2c | 2;
      }
    }
  }
  return stream._4_4_;
}

Assistant:

CURLcode Curl_http2_done_sending(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if((conn->handler == &Curl_handler_http2_ssl) ||
     (conn->handler == &Curl_handler_http2)) {
    /* make sure this is only attempted for HTTP/2 transfers */
    struct HTTP *stream = data->req.p.http;
    struct http_conn *httpc = &conn->proto.httpc;
    nghttp2_session *h2 = httpc->h2;

    if(stream->upload_left) {
      /* If the stream still thinks there's data left to upload. */

      stream->upload_left = 0; /* DONE! */

      /* resume sending here to trigger the callback to get called again so
         that it can signal EOF to nghttp2 */
      (void)nghttp2_session_resume_data(h2, stream->stream_id);
      (void)h2_process_pending_input(data, httpc, &result);
    }

    /* If nghttp2 still has pending frames unsent */
    if(nghttp2_session_want_write(h2)) {
      struct SingleRequest *k = &data->req;
      int rv;

      H2BUGF(infof(data, "HTTP/2 still wants to send data (easy %p)", data));

      /* and attempt to send the pending frames */
      rv = h2_session_send(data, h2);
      if(rv)
        result = CURLE_SEND_ERROR;

      if(nghttp2_session_want_write(h2)) {
         /* re-set KEEP_SEND to make sure we are called again */
         k->keepon |= KEEP_SEND;
      }
    }
  }
  return result;
}